

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolo-image.cpp
# Opt level: O1

void embed_image(yolo_image *source,yolo_image *dest,int dx,int dy)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  pointer pfVar5;
  pointer pfVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  
  iVar1 = source->c;
  if (0 < iVar1) {
    uVar2 = source->w;
    iVar3 = source->h;
    iVar7 = 0;
    iVar9 = 0;
    do {
      if (0 < iVar3) {
        pfVar5 = (source->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4 = dest->w;
        pfVar6 = (dest->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar14 = (dest->h * iVar9 + dy) * iVar4 + dx;
        iVar13 = 0;
        iVar12 = iVar7;
        do {
          uVar11 = (ulong)uVar2;
          iVar8 = iVar12;
          iVar10 = iVar14;
          if (0 < (int)uVar2) {
            do {
              pfVar6[iVar10] = pfVar5[iVar8];
              iVar10 = iVar10 + 1;
              iVar8 = iVar8 + 1;
              uVar11 = uVar11 - 1;
            } while (uVar11 != 0);
          }
          iVar13 = iVar13 + 1;
          iVar14 = iVar14 + iVar4;
          iVar12 = iVar12 + uVar2;
        } while (iVar13 != iVar3);
      }
      iVar9 = iVar9 + 1;
      iVar7 = iVar7 + uVar2 * iVar3;
    } while (iVar9 != iVar1);
  }
  return;
}

Assistant:

static void embed_image(const yolo_image & source, yolo_image & dest, int dx, int dy)
{
    for (int k = 0; k < source.c; ++k) {
        for (int y = 0; y < source.h; ++y) {
            for (int x = 0; x < source.w; ++x) {
                float val = source.get_pixel(x, y, k);
                dest.set_pixel(dx+x, dy+y, k, val);
            }
        }
    }
}